

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O3

void tcu::scale(PixelBufferAccess *dst,ConstPixelBufferAccess *src,FilterMode filter)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int z;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  TextureFormat local_98;
  int aiStack_90 [5];
  ConstPixelBufferAccess local_7c;
  undefined1 local_54;
  undefined8 local_50;
  undefined1 uStack_48;
  undefined7 uStack_47;
  undefined1 uStack_40;
  undefined8 uStack_3f;
  undefined4 local_34;
  
  local_7c.m_size.m_data[2] = 0;
  local_7c.m_pitch.m_data[0] = 0;
  local_7c.m_pitch.m_data[1] = 0;
  local_7c.m_data._4_4_ = 0;
  local_54 = 0;
  local_34 = 0;
  local_50 = 0;
  uStack_48 = 0;
  uStack_47 = 0;
  uStack_40 = 0;
  uStack_3f = 0;
  iVar1 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
  iVar4 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
  fVar6 = (float)(src->m_size).m_data[0] / (float)iVar1;
  fVar7 = (float)(src->m_size).m_data[1] / (float)iVar4;
  iVar3 = (src->m_size).m_data[2];
  iVar2 = (dst->super_ConstPixelBufferAccess).m_size.m_data[2];
  local_7c.m_pitch.m_data[2] = filter;
  local_7c.m_data._0_4_ = filter;
  if (iVar3 == 1 && iVar2 == 1) {
    if (0 < iVar4) {
      iVar3 = 0;
      do {
        if (0 < iVar1) {
          iVar4 = 0;
          do {
            ConstPixelBufferAccess::sample2D
                      (&local_7c,(Sampler *)src,(int)&local_7c + 0x10,((float)iVar4 + 0.5) * fVar6,
                       ((float)iVar3 + 0.5) * fVar7,filter);
            if ((dst->super_ConstPixelBufferAccess).m_format.order - sR < 6) {
              linearToSRGB((tcu *)&local_98,(Vec4 *)&local_7c);
            }
            else {
              local_98 = local_7c.m_format;
              aiStack_90[0] = local_7c.m_size.m_data[0];
              aiStack_90[1] = local_7c.m_size.m_data[1];
            }
            PixelBufferAccess::setPixel(dst,(Vec4 *)&local_98,iVar4,iVar3,0);
            iVar4 = iVar4 + 1;
            iVar1 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
          } while (iVar4 < iVar1);
          iVar4 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 < iVar4);
    }
  }
  else if (0 < iVar2) {
    fVar5 = (float)iVar2;
    z = 0;
    do {
      if (0 < iVar4) {
        iVar2 = 0;
        do {
          if (0 < iVar1) {
            iVar4 = 0;
            do {
              ConstPixelBufferAccess::sample3D
                        (&local_7c,(Sampler *)src,(int)&local_7c + 0x10,((float)iVar4 + 0.5) * fVar6
                         ,((float)iVar2 + 0.5) * fVar7,((float)z + 0.5) * ((float)iVar3 / fVar5));
              if ((dst->super_ConstPixelBufferAccess).m_format.order - sR < 6) {
                linearToSRGB((tcu *)&local_98,(Vec4 *)&local_7c);
              }
              else {
                local_98 = local_7c.m_format;
                aiStack_90[0] = local_7c.m_size.m_data[0];
                aiStack_90[1] = local_7c.m_size.m_data[1];
              }
              PixelBufferAccess::setPixel(dst,(Vec4 *)&local_98,iVar4,iVar2,z);
              iVar4 = iVar4 + 1;
              iVar1 = (dst->super_ConstPixelBufferAccess).m_size.m_data[0];
            } while (iVar4 < iVar1);
            iVar4 = (dst->super_ConstPixelBufferAccess).m_size.m_data[1];
          }
          iVar2 = iVar2 + 1;
        } while (iVar2 < iVar4);
        iVar2 = (dst->super_ConstPixelBufferAccess).m_size.m_data[2];
      }
      z = z + 1;
    } while (z < iVar2);
  }
  return;
}

Assistant:

void scale (const PixelBufferAccess& dst, const ConstPixelBufferAccess& src, Sampler::FilterMode filter)
{
	DE_ASSERT(filter == Sampler::NEAREST || filter == Sampler::LINEAR);

	Sampler sampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE,
					filter, filter, 0.0f, false);

	float sX = (float)src.getWidth() / (float)dst.getWidth();
	float sY = (float)src.getHeight() / (float)dst.getHeight();
	float sZ = (float)src.getDepth() / (float)dst.getDepth();

	if (dst.getDepth() == 1 && src.getDepth() == 1)
	{
		for (int y = 0; y < dst.getHeight(); y++)
		for (int x = 0; x < dst.getWidth(); x++)
			dst.setPixel(linearToSRGBIfNeeded(dst.getFormat(), src.sample2D(sampler, filter, ((float)x+0.5f)*sX, ((float)y+0.5f)*sY, 0)), x, y);
	}
	else
	{
		for (int z = 0; z < dst.getDepth(); z++)
		for (int y = 0; y < dst.getHeight(); y++)
		for (int x = 0; x < dst.getWidth(); x++)
			dst.setPixel(linearToSRGBIfNeeded(dst.getFormat(), src.sample3D(sampler, filter, ((float)x+0.5f)*sX, ((float)y+0.5f)*sY, ((float)z+0.5f)*sZ)), x, y, z);
	}
}